

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# agg_curves.cpp
# Opt level: O0

void __thiscall
agg::curve4_div::recursive_bezier
          (curve4_div *this,double x1,double y1,double x2,double y2,double x3,double y3,double x4,
          double y4,uint level)

{
  double dVar1;
  double dVar2;
  point_base<double> local_1d0;
  point_base<double> local_1c0;
  point_base<double> local_1b0;
  point_base<double> local_1a0;
  point_base<double> local_190;
  point_base<double> local_180;
  point_base<double> local_170;
  point_base<double> local_160;
  point_base<double> local_150;
  point_base<double> local_140;
  point_base<double> local_130;
  point_base<double> local_120;
  point_base<double> local_110;
  point_base<double> local_100;
  double local_f0;
  double k;
  double da2;
  double da1;
  double d3;
  double d2;
  double dy;
  double dx;
  double y1234;
  double x1234;
  double y234;
  double x234;
  double y123;
  double x123;
  double y34;
  double x34;
  double y23;
  double x23;
  double y12;
  double x12;
  double dStack_50;
  uint level_local;
  double y4_local;
  double x4_local;
  double y3_local;
  double x3_local;
  double y2_local;
  double x2_local;
  double y1_local;
  double x1_local;
  curve4_div *this_local;
  
  if (0x20 < level) {
    return;
  }
  y12 = (x1 + x2) * 0.5;
  x23 = (y1 + y2) * 0.5;
  y23 = (x2 + x3) * 0.5;
  x34 = (y2 + y3) * 0.5;
  y34 = (x3 + x4) * 0.5;
  x123 = (y3 + y4) * 0.5;
  y123 = (y12 + y23) * 0.5;
  x234 = (x23 + x34) * 0.5;
  y234 = (y23 + y34) * 0.5;
  x1234 = (x34 + x123) * 0.5;
  y1234 = (y123 + y234) * 0.5;
  dx = (x234 + x1234) * 0.5;
  dy = x4 - x1;
  d2 = y4 - y1;
  d3 = ABS((x2 - x4) * d2 - (y2 - y4) * dy);
  da1 = ABS((x3 - x4) * d2 - (y3 - y4) * dy);
  x12._4_4_ = level;
  dStack_50 = y4;
  y4_local = x4;
  x4_local = y3;
  y3_local = x3;
  x3_local = y2;
  y2_local = x2;
  x2_local = y1;
  y1_local = x1;
  x1_local = (double)this;
  switch((1e-30 < da1) + (1e-30 < d3) * '\x02') {
  case '\0':
    local_f0 = dy * dy + d2 * d2;
    if ((local_f0 != 0.0) || (NAN(local_f0))) {
      local_f0 = 1.0 / local_f0;
      d3 = local_f0 * ((x2 - x1) * dy + (y2 - y1) * d2);
      da2 = x3 - x1;
      k = y3 - y1;
      da1 = local_f0 * (da2 * dy + k * d2);
      if ((0.0 < d3) && (((d3 < 1.0 && (0.0 < da1)) && (da1 < 1.0)))) {
        return;
      }
      if (0.0 < d3) {
        if (d3 < 1.0) {
          d3 = calc_sq_distance(x2,y2,d3 * dy + x1,d3 * d2 + y1);
        }
        else {
          d3 = calc_sq_distance(x2,y2,x4,y4);
        }
      }
      else {
        d3 = calc_sq_distance(x2,y2,x1,y1);
      }
      if (0.0 < da1) {
        if (da1 < 1.0) {
          da1 = calc_sq_distance(y3_local,x4_local,da1 * dy + y1_local,da1 * d2 + x2_local);
        }
        else {
          da1 = calc_sq_distance(y3_local,x4_local,y4_local,dStack_50);
        }
      }
      else {
        da1 = calc_sq_distance(y3_local,x4_local,y1_local,x2_local);
      }
    }
    else {
      d3 = calc_sq_distance(x1,y1,x2,y2);
      da1 = calc_sq_distance(y4_local,dStack_50,y3_local,x4_local);
    }
    if (d3 <= da1) {
      if (da1 < *(double *)(this + 8)) {
        point_base<double>::point_base(&local_110,y3_local,x4_local);
        pod_bvector<agg::point_base<double>,_6U>::add
                  ((pod_bvector<agg::point_base<double>,_6U> *)(this + 0x28),&local_110);
        return;
      }
    }
    else if (d3 < *(double *)(this + 8)) {
      point_base<double>::point_base(&local_100,y2_local,x3_local);
      pod_bvector<agg::point_base<double>,_6U>::add
                ((pod_bvector<agg::point_base<double>,_6U> *)(this + 0x28),&local_100);
      return;
    }
    break;
  case '\x01':
    if (da1 * da1 <= *(double *)(this + 8) * (dy * dy + d2 * d2)) {
      if (*(double *)(this + 0x10) <= 0.01 && *(double *)(this + 0x10) != 0.01) {
        point_base<double>::point_base(&local_120,y23,x34);
        pod_bvector<agg::point_base<double>,_6U>::add
                  ((pod_bvector<agg::point_base<double>,_6U> *)(this + 0x28),&local_120);
        return;
      }
      dVar1 = atan2(y4 - y3,x4 - x3);
      dVar2 = atan2(x4_local - x3_local,y3_local - y2_local);
      da2 = ABS(dVar1 - dVar2);
      if (3.141592653589793 <= da2) {
        da2 = 6.283185307179586 - da2;
      }
      if (da2 < *(double *)(this + 0x10)) {
        point_base<double>::point_base(&local_130,y2_local,x3_local);
        pod_bvector<agg::point_base<double>,_6U>::add
                  ((pod_bvector<agg::point_base<double>,_6U> *)(this + 0x28),&local_130);
        point_base<double>::point_base(&local_140,y3_local,x4_local);
        pod_bvector<agg::point_base<double>,_6U>::add
                  ((pod_bvector<agg::point_base<double>,_6U> *)(this + 0x28),&local_140);
        return;
      }
      if (((*(double *)(this + 0x18) != 0.0) || (NAN(*(double *)(this + 0x18)))) &&
         (*(double *)(this + 0x18) <= da2 && da2 != *(double *)(this + 0x18))) {
        point_base<double>::point_base(&local_150,y3_local,x4_local);
        pod_bvector<agg::point_base<double>,_6U>::add
                  ((pod_bvector<agg::point_base<double>,_6U> *)(this + 0x28),&local_150);
        return;
      }
    }
    break;
  case '\x02':
    if (d3 * d3 <= *(double *)(this + 8) * (dy * dy + d2 * d2)) {
      if (*(double *)(this + 0x10) <= 0.01 && *(double *)(this + 0x10) != 0.01) {
        point_base<double>::point_base(&local_160,y23,x34);
        pod_bvector<agg::point_base<double>,_6U>::add
                  ((pod_bvector<agg::point_base<double>,_6U> *)(this + 0x28),&local_160);
        return;
      }
      dVar1 = atan2(y3 - y2,x3 - x2);
      dVar2 = atan2(x3_local - x2_local,y2_local - y1_local);
      da2 = ABS(dVar1 - dVar2);
      if (3.141592653589793 <= da2) {
        da2 = 6.283185307179586 - da2;
      }
      if (da2 < *(double *)(this + 0x10)) {
        point_base<double>::point_base(&local_170,y2_local,x3_local);
        pod_bvector<agg::point_base<double>,_6U>::add
                  ((pod_bvector<agg::point_base<double>,_6U> *)(this + 0x28),&local_170);
        point_base<double>::point_base(&local_180,y3_local,x4_local);
        pod_bvector<agg::point_base<double>,_6U>::add
                  ((pod_bvector<agg::point_base<double>,_6U> *)(this + 0x28),&local_180);
        return;
      }
      if (((*(double *)(this + 0x18) != 0.0) || (NAN(*(double *)(this + 0x18)))) &&
         (*(double *)(this + 0x18) <= da2 && da2 != *(double *)(this + 0x18))) {
        point_base<double>::point_base(&local_190,y2_local,x3_local);
        pod_bvector<agg::point_base<double>,_6U>::add
                  ((pod_bvector<agg::point_base<double>,_6U> *)(this + 0x28),&local_190);
        return;
      }
    }
    break;
  case '\x03':
    if ((d3 + da1) * (d3 + da1) <= *(double *)(this + 8) * (dy * dy + d2 * d2)) {
      if (*(double *)(this + 0x10) <= 0.01 && *(double *)(this + 0x10) != 0.01) {
        point_base<double>::point_base(&local_1a0,y23,x34);
        pod_bvector<agg::point_base<double>,_6U>::add
                  ((pod_bvector<agg::point_base<double>,_6U> *)(this + 0x28),&local_1a0);
        return;
      }
      dVar1 = atan2(y3 - y2,x3 - x2);
      local_f0 = dVar1;
      dVar2 = atan2(x3_local - x2_local,y2_local - y1_local);
      da2 = ABS(dVar1 - dVar2);
      dVar1 = atan2(dStack_50 - x4_local,y4_local - y3_local);
      k = ABS(dVar1 - local_f0);
      if (3.141592653589793 <= da2) {
        da2 = 6.283185307179586 - da2;
      }
      if (3.141592653589793 <= k) {
        k = 6.283185307179586 - k;
      }
      if (da2 + k < *(double *)(this + 0x10)) {
        point_base<double>::point_base(&local_1b0,y23,x34);
        pod_bvector<agg::point_base<double>,_6U>::add
                  ((pod_bvector<agg::point_base<double>,_6U> *)(this + 0x28),&local_1b0);
        return;
      }
      if ((*(double *)(this + 0x18) != 0.0) || (NAN(*(double *)(this + 0x18)))) {
        if (*(double *)(this + 0x18) <= da2 && da2 != *(double *)(this + 0x18)) {
          point_base<double>::point_base(&local_1c0,y2_local,x3_local);
          pod_bvector<agg::point_base<double>,_6U>::add
                    ((pod_bvector<agg::point_base<double>,_6U> *)(this + 0x28),&local_1c0);
          return;
        }
        if (*(double *)(this + 0x18) <= k && k != *(double *)(this + 0x18)) {
          point_base<double>::point_base(&local_1d0,y3_local,x4_local);
          pod_bvector<agg::point_base<double>,_6U>::add
                    ((pod_bvector<agg::point_base<double>,_6U> *)(this + 0x28),&local_1d0);
          return;
        }
      }
    }
  }
  recursive_bezier(this,y1_local,x2_local,y12,x23,y123,x234,y1234,dx,x12._4_4_ + 1);
  recursive_bezier(this,y1234,dx,y234,x1234,y34,x123,y4_local,dStack_50,x12._4_4_ + 1);
  return;
}

Assistant:

void curve4_div::recursive_bezier(double x1, double y1, 
                                      double x2, double y2, 
                                      double x3, double y3, 
                                      double x4, double y4,
                                      unsigned level)
    {
        if(level > curve_recursion_limit) 
        {
            return;
        }

        // Calculate all the mid-points of the line segments
        //----------------------
        double x12   = (x1 + x2) / 2;
        double y12   = (y1 + y2) / 2;
        double x23   = (x2 + x3) / 2;
        double y23   = (y2 + y3) / 2;
        double x34   = (x3 + x4) / 2;
        double y34   = (y3 + y4) / 2;
        double x123  = (x12 + x23) / 2;
        double y123  = (y12 + y23) / 2;
        double x234  = (x23 + x34) / 2;
        double y234  = (y23 + y34) / 2;
        double x1234 = (x123 + x234) / 2;
        double y1234 = (y123 + y234) / 2;


        // Try to approximate the full cubic curve by a single straight line
        //------------------
        double dx = x4-x1;
        double dy = y4-y1;

        double d2 = fabs(((x2 - x4) * dy - (y2 - y4) * dx));
        double d3 = fabs(((x3 - x4) * dy - (y3 - y4) * dx));
        double da1, da2, k;

        switch((int(d2 > curve_collinearity_epsilon) << 1) +
                int(d3 > curve_collinearity_epsilon))
        {
        case 0:
            // All collinear OR p1==p4
            //----------------------
            k = dx*dx + dy*dy;
            if(k == 0)
            {
                d2 = calc_sq_distance(x1, y1, x2, y2);
                d3 = calc_sq_distance(x4, y4, x3, y3);
            }
            else
            {
                k   = 1 / k;
                da1 = x2 - x1;
                da2 = y2 - y1;
                d2  = k * (da1*dx + da2*dy);
                da1 = x3 - x1;
                da2 = y3 - y1;
                d3  = k * (da1*dx + da2*dy);
                if(d2 > 0 && d2 < 1 && d3 > 0 && d3 < 1)
                {
                    // Simple collinear case, 1---2---3---4
                    // We can leave just two endpoints
                    return;
                }
                     if(d2 <= 0) d2 = calc_sq_distance(x2, y2, x1, y1);
                else if(d2 >= 1) d2 = calc_sq_distance(x2, y2, x4, y4);
                else             d2 = calc_sq_distance(x2, y2, x1 + d2*dx, y1 + d2*dy);

                     if(d3 <= 0) d3 = calc_sq_distance(x3, y3, x1, y1);
                else if(d3 >= 1) d3 = calc_sq_distance(x3, y3, x4, y4);
                else             d3 = calc_sq_distance(x3, y3, x1 + d3*dx, y1 + d3*dy);
            }
            if(d2 > d3)
            {
                if(d2 < m_distance_tolerance_square)
                {
                    m_points.add(point_d(x2, y2));
                    return;
                }
            }
            else
            {
                if(d3 < m_distance_tolerance_square)
                {
                    m_points.add(point_d(x3, y3));
                    return;
                }
            }
            break;

        case 1:
            // p1,p2,p4 are collinear, p3 is significant
            //----------------------
            if(d3 * d3 <= m_distance_tolerance_square * (dx*dx + dy*dy))
            {
                if(m_angle_tolerance < curve_angle_tolerance_epsilon)
                {
                    m_points.add(point_d(x23, y23));
                    return;
                }

                // Angle Condition
                //----------------------
                da1 = fabs(atan2(y4 - y3, x4 - x3) - atan2(y3 - y2, x3 - x2));
                if(da1 >= pi) da1 = 2*pi - da1;

                if(da1 < m_angle_tolerance)
                {
                    m_points.add(point_d(x2, y2));
                    m_points.add(point_d(x3, y3));
                    return;
                }

                if(m_cusp_limit != 0.0)
                {
                    if(da1 > m_cusp_limit)
                    {
                        m_points.add(point_d(x3, y3));
                        return;
                    }
                }
            }
            break;

        case 2:
            // p1,p3,p4 are collinear, p2 is significant
            //----------------------
            if(d2 * d2 <= m_distance_tolerance_square * (dx*dx + dy*dy))
            {
                if(m_angle_tolerance < curve_angle_tolerance_epsilon)
                {
                    m_points.add(point_d(x23, y23));
                    return;
                }

                // Angle Condition
                //----------------------
                da1 = fabs(atan2(y3 - y2, x3 - x2) - atan2(y2 - y1, x2 - x1));
                if(da1 >= pi) da1 = 2*pi - da1;

                if(da1 < m_angle_tolerance)
                {
                    m_points.add(point_d(x2, y2));
                    m_points.add(point_d(x3, y3));
                    return;
                }

                if(m_cusp_limit != 0.0)
                {
                    if(da1 > m_cusp_limit)
                    {
                        m_points.add(point_d(x2, y2));
                        return;
                    }
                }
            }
            break;

        case 3: 
            // Regular case
            //-----------------
            if((d2 + d3)*(d2 + d3) <= m_distance_tolerance_square * (dx*dx + dy*dy))
            {
                // If the curvature doesn't exceed the distance_tolerance value
                // we tend to finish subdivisions.
                //----------------------
                if(m_angle_tolerance < curve_angle_tolerance_epsilon)
                {
                    m_points.add(point_d(x23, y23));
                    return;
                }

                // Angle & Cusp Condition
                //----------------------
                k   = atan2(y3 - y2, x3 - x2);
                da1 = fabs(k - atan2(y2 - y1, x2 - x1));
                da2 = fabs(atan2(y4 - y3, x4 - x3) - k);
                if(da1 >= pi) da1 = 2*pi - da1;
                if(da2 >= pi) da2 = 2*pi - da2;

                if(da1 + da2 < m_angle_tolerance)
                {
                    // Finally we can stop the recursion
                    //----------------------
                    m_points.add(point_d(x23, y23));
                    return;
                }

                if(m_cusp_limit != 0.0)
                {
                    if(da1 > m_cusp_limit)
                    {
                        m_points.add(point_d(x2, y2));
                        return;
                    }

                    if(da2 > m_cusp_limit)
                    {
                        m_points.add(point_d(x3, y3));
                        return;
                    }
                }
            }
            break;
        }

        // Continue subdivision
        //----------------------
        recursive_bezier(x1, y1, x12, y12, x123, y123, x1234, y1234, level + 1); 
        recursive_bezier(x1234, y1234, x234, y234, x34, y34, x4, y4, level + 1); 
    }